

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match_basic_types.cpp
# Opt level: O2

bool __thiscall Potassco::ProgramReader::parse(ProgramReader *this,ReadMode m)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  
  if (this->str_ == (StreamType *)0x0) {
    fail(-2,"bool Potassco::ProgramReader::parse(ReadMode)",0x9f,"str_ != 0","no input stream",0);
  }
  while( true ) {
    iVar3 = (*this->_vptr_ProgramReader[3])(this);
    bVar1 = SUB41(iVar3,0);
    if (bVar1 == false) {
      return false;
    }
    BufferedStream::skipWs(this->str_);
    bVar2 = more(this);
    require(this,(bool)((~bVar2 | this->inc_) & 1),"invalid extra input");
    if (m != Complete) break;
    bVar2 = more(this);
    if (!bVar2) {
      return bVar1;
    }
  }
  return bVar1;
}

Assistant:

bool ProgramReader::parse(ReadMode m) {
	POTASSCO_REQUIRE(str_ != 0, "no input stream");
	do {
		if (!doParse()) { return false; }
		stream()->skipWs();
		require(!more() || incremental(), "invalid extra input");
	} while (m == Complete && more());
	return true;
}